

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_crop.c
# Opt level: O3

gdImagePtr gdImageCropAuto(gdImagePtr im,uint mode)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  gdImagePtr pgVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int r;
  uint uVar13;
  uint uVar14;
  int x;
  bool bVar15;
  gdRect local_48;
  ulong local_38;
  
  x = im->sx;
  iVar9 = im->sy;
  local_48.width = 0;
  local_48.x = 0;
  local_48.y = 0;
  switch(mode) {
  default:
    uVar13 = im->transparent;
    goto LAB_0011327e;
  case 2:
    r = 0;
    iVar12 = 0;
    iVar11 = 0;
    break;
  case 3:
    r = 0xff;
    iVar12 = 0xff;
    iVar11 = 0xff;
    break;
  case 4:
    uVar5 = gdImageGetPixel(im,0,0);
    uVar2 = gdImageGetPixel(im,im->sx + -1,0);
    uVar3 = gdImageGetPixel(im,0,im->sy + -1);
    uVar4 = gdImageGetPixel(im,im->sx + -1,im->sy + -1);
    uVar13 = uVar2;
    if ((uVar2 == uVar4 && uVar2 == uVar3) || (uVar13 = uVar5, uVar5 == uVar4 && uVar5 == uVar3))
    goto LAB_0011327e;
    if ((uVar5 == uVar2 && uVar5 == uVar3) || (uVar5 == uVar2 && uVar5 == uVar4)) goto LAB_0011327e;
    uVar13 = uVar2;
    if ((uVar5 == uVar3 || uVar5 == uVar2) || uVar5 == uVar4) {
      uVar13 = uVar5;
    }
    if (((uVar2 == uVar3) || ((uVar5 == uVar3 || uVar5 == uVar2) || uVar5 == uVar4)) ||
       (uVar13 = uVar3, uVar4 == uVar3)) goto LAB_0011327e;
    if (im->trueColor == 0) {
      iVar8 = im->red[(int)uVar2] + im->red[(int)uVar5] + im->red[(int)uVar3];
      iVar7 = iVar8 + im->red[(int)uVar4];
      iVar8 = im->red[(int)uVar4] + iVar8 + 3;
      if (-1 < iVar7) {
        iVar8 = iVar7;
      }
      uVar13 = iVar8 >> 2;
      iVar8 = im->green[(int)uVar2] + im->green[(int)uVar5] + im->green[(int)uVar3];
      iVar7 = iVar8 + im->green[(int)uVar4];
      iVar8 = im->green[(int)uVar4] + iVar8 + 3;
      if (-1 < iVar7) {
        iVar8 = iVar7;
      }
      uVar14 = iVar8 >> 2;
      iVar8 = im->blue[(int)uVar2] + im->blue[(int)uVar5] + im->blue[(int)uVar3];
      iVar7 = iVar8 + im->blue[(int)uVar4];
      iVar8 = im->blue[(int)uVar4] + iVar8 + 3;
      if (-1 < iVar7) {
        iVar8 = iVar7;
      }
      uVar10 = iVar8 >> 2;
      iVar8 = im->alpha[(int)uVar2] + im->alpha[(int)uVar5] + im->alpha[(int)uVar3];
      uVar5 = im->alpha[(int)uVar4];
    }
    else {
      uVar13 = (uVar4 >> 0x10 & 0xff) + (uVar3 >> 0x10 & 0xff) +
               (uVar2 >> 0x10 & 0xff) + (uVar5 >> 0x10 & 0xff) >> 2;
      uVar14 = (uVar4 >> 8 & 0xff) + (uVar3 >> 8 & 0xff) + (uVar2 >> 8 & 0xff) + (uVar5 >> 8 & 0xff)
               >> 2;
      uVar10 = (uVar4 & 0xff) + (uVar3 & 0xff) + (uVar2 & 0xff) + (uVar5 & 0xff) >> 2;
      iVar8 = (uVar3 >> 0x18 & 0x7f) + (uVar2 >> 0x18 & 0x7f) + (uVar5 >> 0x18 & 0x7f);
      uVar5 = uVar4 >> 0x18 & 0x7f;
    }
    iVar11 = (int)((float)(int)uVar10 + 0.5);
    iVar12 = (int)((float)(int)uVar14 + 0.5);
    r = (int)((float)(int)uVar13 + 0.5);
    iVar7 = uVar5 + 3 + iVar8;
    if (-1 < (int)(uVar5 + iVar8)) {
      iVar7 = uVar5 + iVar8;
    }
    iVar8 = (int)((float)(iVar7 >> 2) + 0.5);
    goto LAB_00113277;
  }
  iVar8 = 0;
LAB_00113277:
  uVar13 = gdImageColorClosestAlpha(im,r,iVar12,iVar11,iVar8);
LAB_0011327e:
  if (iVar9 < 1) {
    iVar8 = iVar9 + -1;
    local_48.y = -1;
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    do {
      iVar11 = iVar7;
      if (x < 1) {
        bVar15 = true;
      }
      else {
        iVar8 = 1;
        do {
          uVar5 = gdImageGetPixel(im,iVar8 + -1,iVar11);
          bVar15 = uVar13 == uVar5;
          if (!bVar15) break;
          bVar1 = iVar8 < x;
          iVar8 = iVar8 + 1;
        } while (bVar1);
      }
      iVar7 = iVar11 + 1;
    } while ((bVar15) && (iVar7 < iVar9));
    if (iVar7 == iVar9 + -1) {
      return (gdImagePtr)0x0;
    }
    iVar8 = iVar9 + -1;
    local_48.y = iVar11;
    iVar11 = iVar9;
    do {
      iVar12 = iVar8;
      iVar8 = iVar12;
      if (iVar11 < 1) break;
      if (x < 1) {
        bVar15 = true;
      }
      else {
        iVar8 = 1;
        do {
          uVar5 = gdImageGetPixel(im,iVar8 + -1,iVar12);
          bVar15 = uVar13 == uVar5;
          if (!bVar15) break;
          bVar1 = iVar8 < x;
          iVar8 = iVar8 + 1;
        } while (bVar1);
      }
      iVar8 = iVar12 + -1;
      iVar11 = iVar12;
    } while (bVar15);
  }
  local_48.height = (iVar9 - iVar7) + 2;
  if (iVar8 != 0) {
    local_48.height = (iVar8 - iVar7) + 3;
  }
  if (x < 1) {
    local_48.x = -1;
    iVar9 = 0;
  }
  else {
    iVar8 = local_48.height + iVar7 + -2;
    iVar9 = 0;
    local_38 = (ulong)(uint)local_48.height;
    do {
      iVar11 = iVar9;
      if (iVar8 < 1) {
        bVar15 = true;
      }
      else {
        iVar9 = 1;
        do {
          uVar5 = gdImageGetPixel(im,iVar11,iVar9 + -1);
          bVar15 = uVar13 == uVar5;
          if (!bVar15) break;
          bVar1 = iVar9 < iVar8;
          iVar9 = iVar9 + 1;
        } while (bVar1);
      }
      iVar9 = iVar11 + 1;
    } while ((bVar15) && (iVar9 < x));
    local_48.x = iVar11;
    if (0 < x) {
      iVar7 = iVar7 + (int)local_38 + -2;
      iVar8 = x;
      do {
        x = iVar8 + -1;
        if (iVar7 < 1) {
          bVar15 = true;
        }
        else {
          iVar11 = 1;
          do {
            uVar5 = gdImageGetPixel(im,x,iVar11 + -1);
            bVar15 = uVar13 == uVar5;
            if (!bVar15) break;
            bVar1 = iVar11 < iVar7;
            iVar11 = iVar11 + 1;
          } while (bVar1);
        }
      } while ((bVar15) && (bVar15 = 1 < iVar8, iVar8 = x, bVar15));
    }
  }
  local_48.width = (x - iVar9) + 2;
  pgVar6 = gdImageCrop(im,&local_48);
  return pgVar6;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCropAuto(gdImagePtr im, const unsigned int mode)
{
	const int width = gdImageSX(im);
	const int height = gdImageSY(im);

	int x,y;
	int color, match;
	gdRect crop;

	crop.x = 0;
	crop.y = 0;
	crop.width = 0;
	crop.height = 0;

	switch (mode) {
	case GD_CROP_TRANSPARENT:
		color = gdImageGetTransparent(im);
		break;

	case GD_CROP_BLACK:
		color = gdImageColorClosestAlpha(im, 0, 0, 0, 0);
		break;

	case GD_CROP_WHITE:
		color = gdImageColorClosestAlpha(im, 255, 255, 255, 0);
		break;

	case GD_CROP_SIDES:
		gdGuessBackgroundColorFromCorners(im, &color);
		break;

	case GD_CROP_DEFAULT:
	default:
		color = gdImageGetTransparent(im);
		break;
	}

	/* TODO: Add gdImageGetRowPtr and works with ptr at the row level
	 * for the true color and palette images
	 * new formats will simply work with ptr
	 */
	match = 1;
	for (y = 0; match && y < height; y++) {
		for (x = 0; match && x < width; x++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}

	/* Nothing to do > bye
	 * Duplicate the image?
	 */
	if (y == height - 1) {
		return NULL;
	}

	crop.y = y -1;
	match = 1;
	for (y = height - 1; match && y >= 0; y--) {
		for (x = 0; match && x < width; x++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}

	if (y == 0) {
		crop.height = height - crop.y + 1;
	} else {
		crop.height = y - crop.y + 2;
	}

	match = 1;
	for (x = 0; match && x < width; x++) {
		for (y = 0; match && y < crop.y + crop.height - 1; y++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}
	crop.x = x - 1;

	match = 1;
	for (x = width - 1; match && x >= 0; x--) {
		for (y = 0; match &&  y < crop.y + crop.height - 1; y++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}
	crop.width = x - crop.x + 2;

	return gdImageCrop(im, &crop);
}